

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O0

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
AssignmentOverwritesExisting<phmap::flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>_>
::TestBody(AssignmentOverwritesExisting<phmap::flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>_>
           *this)

{
  initializer_list<std::pair<const_phmap::priv::NonStandardLayout,_int>_> iVar1;
  initializer_list<std::pair<const_phmap::priv::NonStandardLayout,_int>_> iVar2;
  bool bVar3;
  char *message;
  pair<const_phmap::priv::NonStandardLayout,_int> *local_218;
  pair<const_phmap::priv::NonStandardLayout,_int> *local_200;
  AssertHelper local_1f8;
  Message local_1f0;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar;
  StatefulTestingEqual local_1d0;
  StatefulTestingHash local_1c8;
  pair<const_phmap::priv::NonStandardLayout,_int> *local_1c0;
  pair<const_phmap::priv::NonStandardLayout,_int> local_1b8;
  undefined1 local_188 [24];
  TypeParam n;
  StatefulTestingEqual local_128;
  StatefulTestingHash local_120 [3];
  pair<const_phmap::priv::NonStandardLayout,_int> *local_108;
  pair<const_phmap::priv::NonStandardLayout,_int> local_100;
  pair<const_phmap::priv::NonStandardLayout,_int> local_d0;
  pair<const_phmap::priv::NonStandardLayout,_int> local_a0;
  undefined1 local_70 [24];
  TypeParam m;
  Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> gen;
  AssignmentOverwritesExisting<phmap::flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>_>
  *this_local;
  
  local_108 = &local_100;
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (local_108,
             (Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *)
             ((long)&m.
                     super_raw_hash_map<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                     .
                     super_raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                     .settings_.
                     super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                     .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl + 7));
  local_108 = &local_d0;
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (local_108,
             (Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *)
             ((long)&m.
                     super_raw_hash_map<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                     .
                     super_raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                     .settings_.
                     super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                     .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl + 7));
  local_108 = &local_a0;
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (local_108,
             (Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *)
             ((long)&m.
                     super_raw_hash_map<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                     .
                     super_raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                     .settings_.
                     super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                     .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl + 7));
  local_70._0_8_ = &local_100;
  local_70._8_8_ = 3;
  local_120[0].super_WithId<phmap::priv::StatefulTestingHash>.id_ =
       (WithId<phmap::priv::StatefulTestingHash>)0;
  StatefulTestingHash::StatefulTestingHash(local_120);
  local_128.super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (WithId<phmap::priv::StatefulTestingEqual>)0;
  StatefulTestingEqual::StatefulTestingEqual(&local_128);
  Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>::Alloc
            ((Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_> *)
             &n.
              super_raw_hash_map<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
              .
              super_raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
              .settings_.
              super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
              .super__Head_base<0UL,_unsigned_long,_false>,0);
  iVar2._M_len = local_70._8_8_;
  iVar2._M_array = (iterator)local_70._0_8_;
  flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::raw_hash_set((flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                  *)(local_70 + 0x10),iVar2,0,local_120,&local_128,
                 (allocator_type *)
                 &n.
                  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                  .
                  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                  .settings_.
                  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                  .super__Head_base<0UL,_unsigned_long,_false>);
  Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>::~Alloc
            ((Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_> *)
             &n.
              super_raw_hash_map<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
              .
              super_raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
              .settings_.
              super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
              .super__Head_base<0UL,_unsigned_long,_false>);
  local_200 = (pair<const_phmap::priv::NonStandardLayout,_int> *)local_70;
  do {
    local_200 = local_200 + -1;
    std::pair<const_phmap::priv::NonStandardLayout,_int>::~pair(local_200);
  } while (local_200 != &local_100);
  local_1c0 = &local_1b8;
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (local_1c0,
             (Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *)
             ((long)&m.
                     super_raw_hash_map<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                     .
                     super_raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                     .settings_.
                     super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                     .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl + 7));
  local_188._0_8_ = &local_1b8;
  local_188._8_8_ = 1;
  local_1c8.super_WithId<phmap::priv::StatefulTestingHash>.id_ =
       (WithId<phmap::priv::StatefulTestingHash>)0;
  StatefulTestingHash::StatefulTestingHash(&local_1c8);
  local_1d0.super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (WithId<phmap::priv::StatefulTestingEqual>)0;
  StatefulTestingEqual::StatefulTestingEqual(&local_1d0);
  Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>::Alloc
            ((Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_> *)&gtest_ar.message_,0);
  iVar1._M_len = local_188._8_8_;
  iVar1._M_array = (iterator)local_188._0_8_;
  flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::raw_hash_set((flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                  *)(local_188 + 0x10),iVar1,0,&local_1c8,&local_1d0,
                 (allocator_type *)&gtest_ar.message_);
  Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>::~Alloc
            ((Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_> *)&gtest_ar.message_);
  local_218 = (pair<const_phmap::priv::NonStandardLayout,_int> *)local_188;
  do {
    local_218 = local_218 + -1;
    std::pair<const_phmap::priv::NonStandardLayout,_int>::~pair(local_218);
  } while (local_218 != &local_1b8);
  flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::operator=((flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
               *)(local_188 + 0x10),
              (flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
               *)(local_70 + 0x10));
  testing::internal::EqHelper::
  Compare<phmap::flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>,_phmap::flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>,_nullptr>
            ((EqHelper *)local_1e8,"m","n",
             (flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
              *)(local_70 + 0x10),
             (flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
              *)(local_188 + 0x10));
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar3) {
    testing::Message::Message(&local_1f0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x1bf,message);
    testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::~flat_hash_map((flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                    *)(local_188 + 0x10));
  flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::~flat_hash_map((flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                    *)(local_70 + 0x10));
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, AssignmentOverwritesExisting) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  TypeParam m({gen(), gen(), gen()});
  TypeParam n({gen()});
  n = m;
  EXPECT_EQ(m, n);
}